

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger table_map(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue this;
  SQObjectPtr *pSVar2;
  SQObjectValue this_00;
  SQObject *closure;
  SQInteger params;
  SQInteger x;
  SQRESULT SVar3;
  SQObjectPtr itr;
  SQObjectPtr local_a0;
  SQInteger local_90;
  SQObjectPtr ret;
  SQObjectPtr val;
  SQObjectPtr temp;
  SQObjectPtr key;
  
  pSVar2 = stack_get(v,1);
  this_00.pTable =
       SQTable::Create(v->_sharedstate,(ulong)((pSVar2->super_SQObject)._unVal.pTable)->_usednodes);
  ret.super_SQObject._type = OT_TABLE;
  ret.super_SQObject._flags = '\0';
  pSVar1 = &((this_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  this = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pTable;
  temp.super_SQObject._unVal.pTable = (SQTable *)0x0;
  temp.super_SQObject._type = OT_NULL;
  temp.super_SQObject._flags = '\0';
  temp.super_SQObject._5_3_ = 0;
  ret.super_SQObject._unVal.pTable = this_00.pTable;
  closure = &stack_get(v,2)->super_SQObject;
  itr.super_SQObject._type = closure->_type;
  itr.super_SQObject._flags = closure->_flags;
  itr.super_SQObject._5_3_ = *(undefined3 *)&closure->field_0x5;
  itr.super_SQObject._unVal = (SQObjectValue)(closure->_unVal).pTable;
  if ((itr.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((itr.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQVM::Push(v,&itr);
  SQObjectPtr::~SQObjectPtr(&itr);
  params = get_allowed_args_count(closure,4);
  itr.super_SQObject._unVal.pTable = (SQTable *)0x0;
  itr.super_SQObject._type = OT_NULL;
  itr.super_SQObject._flags = '\0';
  itr.super_SQObject._5_3_ = 0;
  key.super_SQObject._unVal.pTable = (SQTable *)0x0;
  key.super_SQObject._type = OT_NULL;
  key.super_SQObject._flags = '\0';
  key.super_SQObject._5_3_ = 0;
  val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  val.super_SQObject._type = OT_NULL;
  val.super_SQObject._flags = '\0';
  val.super_SQObject._5_3_ = 0;
  local_90 = -1;
  do {
    while( true ) {
      x = SQTable::Next(this.pTable,false,&itr,&key,&val);
      if (x == -1) {
        SQVM::Pop(v);
        goto LAB_0011b4f0;
      }
      SQObjectPtr::operator=(&itr,x);
      local_a0.super_SQObject._type = OT_TABLE;
      local_a0.super_SQObject._flags = '\0';
      pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_a0.super_SQObject._unVal = this;
      SQVM::Push(v,&local_a0);
      SQObjectPtr::~SQObjectPtr(&local_a0);
      SQVM::Push(v,&val);
      if ((2 < params) && (SQVM::Push(v,&key), params != 3)) {
        local_a0.super_SQObject._type = OT_TABLE;
        local_a0.super_SQObject._flags = '\0';
        pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        local_a0.super_SQObject._unVal = this;
        SQVM::Push(v,&local_a0);
        SQObjectPtr::~SQObjectPtr(&local_a0);
      }
      SVar3 = sq_call(v,params,1,1);
      if (SVar3 < 0) break;
      pSVar2 = SQVM::GetUp(v,-1);
      SQTable::NewSlot(this_00.pTable,&key,pSVar2);
      SQVM::Pop(v);
    }
  } while ((v->_lasterror).super_SQObject._type == OT_NULL);
LAB_0011b4f0:
  SQObjectPtr::~SQObjectPtr(&val);
  SQObjectPtr::~SQObjectPtr(&key);
  SQObjectPtr::~SQObjectPtr(&itr);
  SQObjectPtr::~SQObjectPtr(&temp);
  if (x == -1) {
    SQVM::Push(v,&ret);
    local_90 = 1;
  }
  SQObjectPtr::~SQObjectPtr(&ret);
  return local_90;
}

Assistant:

static SQInteger table_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObjectPtr ret = SQTable::Create(_ss(v), _table(o)->CountUsed());
    if(SQ_FAILED(__map_table(_table(ret), _table(o), v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}